

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

void ParseSpawnMap(FScanner *sc,SpawnMap *themap,char *descript)

{
  IPair *pIVar1;
  uint key;
  bool bVar2;
  Node *pNVar3;
  char *message;
  MapinfoSpawnItem editem;
  MapinfoSpawnItem local_60;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> local_48;
  
  local_48.NumUsed = 0;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::SetNodeVector(&local_48,1);
  local_60.classname.Index = 0;
  local_60.filename.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FString::operator=(&local_60.filename,&sc->ScriptName);
  do {
    while( true ) {
      bVar2 = FScanner::CheckString(sc,"}");
      if (bVar2) {
        FString::~FString(&local_60.filename);
        M_Free(local_48.Nodes);
        return;
      }
      bVar2 = FScanner::CheckNumber(sc);
      if (bVar2) break;
      FScanner::ScriptError(sc,"Number expected");
    }
    key = sc->Number;
    FScanner::MustGetStringName(sc,"=");
    FScanner::MustGetString(sc);
    pNVar3 = local_48.Nodes + (local_48.Size - 1 & key);
    do {
      if ((pNVar3 == (Node *)0x0) || (pNVar3->Next == (Node *)0x1)) {
        message = "%s must be positive, got %d";
        if ((int)key < 0) goto LAB_0045baa4;
        goto LAB_0045bab3;
      }
      pIVar1 = &pNVar3->Pair;
      pNVar3 = pNVar3->Next;
    } while (pIVar1->Key != key);
    message = "%s %d defined more than once";
LAB_0045baa4:
    FScanner::ScriptMessage(sc,message,descript,(ulong)key);
LAB_0045bab3:
    pNVar3 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::GetNode(&local_48,key);
    (pNVar3->Pair).Value = true;
    local_60.classname.Index = FName::NameManager::FindName(&FName::NameData,sc->String,false);
    local_60.linenum = sc->Line;
    TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
              (themap,key,&local_60);
  } while( true );
}

Assistant:

static void ParseSpawnMap(FScanner &sc, SpawnMap & themap, const char *descript)
{
	TMap<int, bool> defined;
	int error = 0;

	MapinfoSpawnItem editem;

	editem.filename = sc.ScriptName;

	while (true)
	{
		if (sc.CheckString("}")) return;
		else if (sc.CheckNumber())
		{
			int ednum = sc.Number;
			sc.MustGetStringName("=");
			sc.MustGetString();

			bool *def = defined.CheckKey(ednum);
			if (def != NULL)
			{
				sc.ScriptMessage("%s %d defined more than once", descript, ednum);
				error++;
			}
			else if (ednum < 0)
			{
				sc.ScriptMessage("%s must be positive, got %d", descript, ednum);
				error++;
			}
			defined[ednum] = true;
			editem.classname = sc.String;
			editem.linenum = sc.Line;

			themap.Insert(ednum, editem);
		}
		else
		{
			sc.ScriptError("Number expected");
		}
	}
	if (error > 0)
	{
		sc.ScriptError("%d errors encountered in %s definition", error, descript);
	}
}